

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

void apply_view_transform(render_state_t *state,float width,float height)

{
  _Bool _Var1;
  float sx;
  float local_58;
  float local_54;
  float local_50;
  float view_height;
  float view_width;
  float offset_y;
  float offset_x;
  float scale;
  float scale_y;
  float scale_x;
  view_position_t position;
  plutovg_rect_t view_box;
  float height_local;
  float width_local;
  render_state_t *state_local;
  
  memset(&position,0,0x10);
  _Var1 = parse_view_box(state->element,0x27,(plutovg_rect_t *)&position);
  if (!_Var1) {
    return;
  }
  scale_y = 7.00649e-45;
  scale_x = 0.0;
  parse_view_position(state->element,0x16,(view_position_t *)&scale_y);
  sx = width / view_box.x;
  local_58 = height / view_box.y;
  if (scale_y == 0.0) {
    plutovg_matrix_scale(&state->matrix,sx,local_58);
    plutovg_matrix_translate(&state->matrix,-(float)position.align,-(float)position.scale);
    goto LAB_00107c24;
  }
  if (scale_x == 0.0) {
    local_50 = local_58;
    if (sx < local_58) {
      local_50 = sx;
    }
    local_54 = local_50;
  }
  else {
    if (local_58 < sx) {
      local_58 = sx;
    }
    local_54 = local_58;
  }
  view_width = -(float)position.align * local_54;
  view_height = -(float)position.scale * local_54;
  if (scale_y == 2.8026e-45) {
LAB_00107b5d:
    view_width = (width - view_box.x * local_54) * 0.5 + view_width;
  }
  else if (scale_y == 4.2039e-45) {
LAB_00107b83:
    view_width = (width - view_box.x * local_54) + view_width;
  }
  else {
    if (scale_y == 7.00649e-45) goto LAB_00107b5d;
    if (scale_y == 8.40779e-45) goto LAB_00107b83;
    if (scale_y == 1.12104e-44) goto LAB_00107b5d;
    if (scale_y == 1.26117e-44) goto LAB_00107b83;
  }
  if ((int)scale_y - 4U < 3) {
    view_height = (height - view_box.y * local_54) * 0.5 + view_height;
  }
  else if ((int)scale_y - 7U < 3) {
    view_height = (height - view_box.y * local_54) + view_height;
  }
  plutovg_matrix_translate(&state->matrix,view_width,view_height);
  plutovg_matrix_scale(&state->matrix,local_54,local_54);
LAB_00107c24:
  state->view_width = view_box.x;
  state->view_height = view_box.y;
  return;
}

Assistant:

static void apply_view_transform(render_state_t* state, float width, float height)
{
    plutovg_rect_t view_box = {0, 0, 0, 0};
    if(!parse_view_box(state->element, ATTR_VIEW_BOX, &view_box))
        return;
    view_position_t position = {view_align_x_mid_y_mid, view_scale_meet};
    parse_view_position(state->element, ATTR_PRESERVE_ASPECT_RATIO, &position);
    float scale_x = width / view_box.w;
    float scale_y = height / view_box.h;
    if(position.align == view_align_none) {
        plutovg_matrix_scale(&state->matrix, scale_x, scale_y);
        plutovg_matrix_translate(&state->matrix, -view_box.x, -view_box.y);
    } else {
        float scale = (position.scale == view_scale_meet) ? MIN(scale_x, scale_y) : MAX(scale_x, scale_y);
        float offset_x = -view_box.x * scale;
        float offset_y = -view_box.y * scale;
        float view_width = view_box.w * scale;
        float view_height = view_box.h * scale;
        switch(position.align) {
        case view_align_x_mid_y_min:
        case view_align_x_mid_y_mid:
        case view_align_x_mid_y_max:
            offset_x += (width - view_width) * 0.5f;
            break;
        case view_align_x_max_y_min:
        case view_align_x_max_y_mid:
        case view_align_x_max_y_max:
            offset_x += (width - view_width);
            break;
        default:
            break;
        }

        switch(position.align) {
        case view_align_x_min_y_mid:
        case view_align_x_mid_y_mid:
        case view_align_x_max_y_mid:
            offset_y += (height - view_height) * 0.5f;
            break;
        case view_align_x_min_y_max:
        case view_align_x_mid_y_max:
        case view_align_x_max_y_max:
            offset_y += (height - view_height);
            break;
        default:
            break;
        }

        plutovg_matrix_translate(&state->matrix, offset_x, offset_y);
        plutovg_matrix_scale(&state->matrix, scale, scale);
    }

    state->view_width = view_box.w;
    state->view_height = view_box.h;
}